

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

void crnlib::remap_alpha_endpoints
               (uint16 *remapping,unpacked_endpoint *unpacked_endpoints,uint *hist,uint16 n,
               uint16 selected,float weight)

{
  byte *pbVar1;
  byte *pbVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint *puVar12;
  unsigned_short *puVar13;
  byte *pbVar14;
  ulong a;
  ulong b;
  unsigned_long_long uVar15;
  ulong uVar16;
  ushort in_CX;
  long in_RDX;
  long in_RSI;
  vector<unsigned_int> *in_RDI;
  ushort in_R8W;
  float in_XMM0_Da;
  uint16 i_3;
  uint16 i_2;
  int scale;
  int back;
  int front;
  uint frequency_back;
  uint frequency_front;
  uint64 value;
  uint64 similarity_back;
  uint64 similarity_front;
  uint error_back;
  uint error_front;
  unpacked_endpoint *e_remaining;
  uint remaining_index;
  uint16 i_1;
  uint64 selected_similarity_back;
  uint64 selected_similarity_front;
  uint64 best_value;
  uint16 selected_index;
  unpacked_endpoint *e_back;
  unpacked_endpoint *e_front;
  uint total_frequency_normalizer;
  uint similarity_base;
  uint16 i;
  vector<unsigned_int> total_frequency;
  vector<unsigned_short> remaining;
  vector<unsigned_short> chosen;
  uint *frequency;
  undefined4 in_stack_fffffffffffffe08;
  undefined2 in_stack_fffffffffffffe0c;
  undefined2 in_stack_fffffffffffffe0e;
  ushort uVar17;
  vector<unsigned_int> *in_stack_fffffffffffffe10;
  ushort local_f0;
  ushort local_ee;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  uint local_e0;
  uint local_dc;
  ushort local_aa;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ushort local_8a;
  uint local_74;
  ushort local_6a;
  vector<unsigned_int> local_68 [2];
  vector<unsigned_short> local_48;
  vector<unsigned_short> local_38;
  long local_28;
  float local_20;
  ushort local_1c;
  ushort local_1a;
  long local_18;
  long local_10;
  vector<unsigned_int> *local_8;
  
  local_28 = in_RDX + (long)(int)((uint)in_R8W * (uint)in_CX) * 4;
  local_20 = in_XMM0_Da;
  local_1c = in_R8W;
  local_1a = in_CX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  vector<unsigned_short>::vector(&local_38);
  vector<unsigned_short>::vector(&local_48);
  vector<unsigned_int>::vector
            (in_stack_fffffffffffffe10,CONCAT22(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe0c)
            );
  vector<unsigned_short>::push_back
            ((vector<unsigned_short> *)in_stack_fffffffffffffe10,
             (unsigned_short *)
             CONCAT26(in_stack_fffffffffffffe0e,
                      CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)));
  for (local_6a = 0; local_6a < local_1a; local_6a = local_6a + 1) {
    if (local_6a != local_1c) {
      vector<unsigned_short>::push_back
                ((vector<unsigned_short> *)in_stack_fffffffffffffe10,
                 (unsigned_short *)
                 CONCAT26(in_stack_fffffffffffffe0e,
                          CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)));
      uVar11 = *(uint *)(local_28 + (ulong)local_6a * 4);
      puVar12 = vector<unsigned_int>::operator[](local_68,(uint)local_6a);
      *puVar12 = uVar11;
    }
  }
  iVar5 = (int)(long)((local_20 + 1.0) * 1000.0);
  local_74 = 0;
  while (uVar6 = vector<unsigned_short>::size(&local_48), lVar3 = local_10, uVar6 != 0) {
    puVar13 = vector<unsigned_short>::front(&local_38);
    lVar4 = local_10;
    pbVar1 = (byte *)(lVar3 + (ulong)*puVar13 * 2);
    puVar13 = vector<unsigned_short>::back(&local_38);
    pbVar14 = (byte *)(lVar4 + (ulong)*puVar13 * 2);
    local_8a = 0;
    local_98 = 0;
    local_a0 = 0;
    local_a8 = 0;
    for (local_aa = 0; uVar6 = vector<unsigned_short>::size(&local_48), local_aa < uVar6;
        local_aa = local_aa + 1) {
      puVar13 = vector<unsigned_short>::operator[](&local_48,(uint)local_aa);
      uVar17 = *puVar13;
      pbVar2 = (byte *)(local_10 + (ulong)(uint)uVar17 * 2);
      iVar7 = math::square<int>((uint)*pbVar2 - (uint)*pbVar1);
      iVar8 = math::square<int>((uint)pbVar2[1] - (uint)pbVar1[1]);
      iVar9 = math::square<int>((uint)*pbVar2 - (uint)*pbVar14);
      iVar10 = math::square<int>((uint)pbVar2[1] - (uint)pbVar14[1]);
      uVar11 = math::minimum<unsigned_int>(iVar7 + iVar8,1000);
      a = (ulong)(iVar5 - uVar11);
      uVar11 = math::minimum<unsigned_int>(iVar9 + iVar10,1000);
      b = (ulong)(iVar5 - uVar11);
      uVar15 = math::maximum<unsigned_long_long>(a,b);
      puVar12 = vector<unsigned_int>::operator[](local_68,(uint)uVar17);
      uVar16 = uVar15 * (*puVar12 + local_74) + 1;
      if (local_98 < uVar16) {
        local_8a = local_aa;
        local_a8 = b;
        local_a0 = a;
        local_98 = uVar16;
      }
    }
    puVar13 = vector<unsigned_short>::operator[](&local_48,(uint)local_8a);
    local_1c = *puVar13;
    local_28 = local_18 + (long)(int)((uint)local_1c * (uint)local_1a) * 4;
    puVar12 = vector<unsigned_int>::operator[](local_68,(uint)local_1c);
    local_74 = *puVar12;
    local_dc = 0;
    local_e0 = 0;
    local_e4 = 0;
    local_ec = vector<unsigned_short>::size(&local_38);
    local_ec = local_ec - 1;
    local_e8 = local_ec;
    for (; lVar3 = local_28, 0 < (int)local_ec; local_ec = local_ec - 2) {
      puVar13 = vector<unsigned_short>::operator[](&local_38,local_e4);
      lVar4 = local_28;
      local_dc = local_dc + local_ec * *(int *)(lVar3 + (ulong)*puVar13 * 4);
      puVar13 = vector<unsigned_short>::operator[](&local_38,local_e8);
      local_e0 = local_ec * *(int *)(lVar4 + (ulong)*puVar13 * 4) + local_e0;
      local_e4 = local_e4 + 1;
      local_e8 = local_e8 - 1;
    }
    if (local_a0 * local_dc < local_a8 * local_e0 || local_a0 * local_dc - local_a8 * local_e0 == 0)
    {
      vector<unsigned_short>::push_back
                ((vector<unsigned_short> *)in_stack_fffffffffffffe10,
                 (unsigned_short *)
                 CONCAT26(in_stack_fffffffffffffe0e,
                          CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)));
    }
    else {
      vector<unsigned_short>::push_front
                ((vector<unsigned_short> *)in_stack_fffffffffffffe10,
                 (unsigned_short *)
                 CONCAT26(in_stack_fffffffffffffe0e,
                          CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)));
    }
    vector<unsigned_short>::begin(&local_48);
    vector<unsigned_short>::erase
              ((vector<unsigned_short> *)in_stack_fffffffffffffe10,
               (unsigned_short *)
               CONCAT26(in_stack_fffffffffffffe0e,
                        CONCAT24(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)));
    for (local_ee = 0; uVar6 = vector<unsigned_short>::size(&local_48), lVar3 = local_28,
        local_ee < uVar6; local_ee = local_ee + 1) {
      puVar13 = vector<unsigned_short>::operator[](&local_48,(uint)local_ee);
      iVar7 = *(int *)(lVar3 + (ulong)*puVar13 * 4);
      puVar13 = vector<unsigned_short>::operator[](&local_48,(uint)local_ee);
      puVar12 = vector<unsigned_int>::operator[](local_68,(uint)*puVar13);
      *puVar12 = iVar7 + *puVar12;
    }
  }
  for (local_f0 = 0; local_f0 < local_1a; local_f0 = local_f0 + 1) {
    uVar17 = local_f0;
    in_stack_fffffffffffffe10 = local_8;
    puVar13 = vector<unsigned_short>::operator[](&local_38,(uint)local_f0);
    *(ushort *)((long)&in_stack_fffffffffffffe10->m_p + (ulong)*puVar13 * 2) = uVar17;
  }
  vector<unsigned_int>::~vector(in_stack_fffffffffffffe10);
  vector<unsigned_short>::~vector((vector<unsigned_short> *)in_stack_fffffffffffffe10);
  vector<unsigned_short>::~vector((vector<unsigned_short> *)in_stack_fffffffffffffe10);
  return;
}

Assistant:

static void remap_alpha_endpoints(uint16* remapping, const optimize_alpha_params::unpacked_endpoint* unpacked_endpoints, const uint* hist, uint16 n, uint16 selected, float weight) {
  const uint* frequency = hist + selected * n;
  crnlib::vector<uint16> chosen, remaining;
  crnlib::vector<uint> total_frequency(n);
  chosen.push_back(selected);
  for (uint16 i = 0; i < n; i++) {
    if (i != selected) {
      remaining.push_back(i);
      total_frequency[i] = frequency[i];
    }
  }
  for (uint similarity_base = (uint)(1000 * (1.0f + weight)), total_frequency_normalizer = 0; remaining.size();) {
    const optimize_alpha_params::unpacked_endpoint& e_front = unpacked_endpoints[chosen.front()];
    const optimize_alpha_params::unpacked_endpoint& e_back = unpacked_endpoints[chosen.back()];
    uint16 selected_index = 0;
    uint64 best_value = 0, selected_similarity_front = 0, selected_similarity_back = 0;
    for (uint16 i = 0; i < remaining.size(); i++) {
      uint remaining_index = remaining[i];
      const optimize_alpha_params::unpacked_endpoint& e_remaining = unpacked_endpoints[remaining_index];
      uint error_front = math::square(e_remaining.low - e_front.low) + math::square(e_remaining.high - e_front.high);
      uint error_back = math::square(e_remaining.low - e_back.low) + math::square(e_remaining.high - e_back.high);
      uint64 similarity_front = similarity_base - math::minimum<uint>(error_front, 1000);
      uint64 similarity_back = similarity_base - math::minimum<uint>(error_back, 1000);
      uint64 value = math::maximum(similarity_front, similarity_back) * (total_frequency[remaining_index] + total_frequency_normalizer) + 1;
      if (value > best_value) {
        best_value = value;
        selected_index = i;
        selected_similarity_front = similarity_front;
        selected_similarity_back = similarity_back;
      }
    }
    selected = remaining[selected_index];
    frequency = hist + selected * n;
    total_frequency_normalizer = total_frequency[selected];
    uint frequency_front = 0, frequency_back = 0;
    for (int front = 0, back = chosen.size() - 1, scale = back; scale > 0; front++, back--, scale -= 2) {
      frequency_front += scale * frequency[chosen[front]];
      frequency_back += scale * frequency[chosen[back]];
    }
    if (selected_similarity_front * frequency_front > selected_similarity_back * frequency_back) {
      chosen.push_front(selected);
    } else {
      chosen.push_back(selected);
    }
    remaining.erase(remaining.begin() + selected_index);
    for (uint16 i = 0; i < remaining.size(); i++)
      total_frequency[remaining[i]] += frequency[remaining[i]];
  }
  for (uint16 i = 0; i < n; i++)
    remapping[chosen[i]] = i;
}